

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::ScalarReplacementPass::ProcessFunction
          (ScalarReplacementPass *this,Function *function)

{
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> _Var1;
  Instruction *pIVar2;
  bool bVar3;
  Status SVar4;
  Status SVar5;
  Instruction **ppIVar6;
  Instruction *varInst;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  worklist;
  
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            (&worklist);
  _Var1._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (((function->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  ppIVar6 = (Instruction **)
            ((long)_Var1._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x20);
  while ((pIVar2 = *ppIVar6,
         pIVar2 != (Instruction *)
                   ((long)_Var1._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl +
                   0x18) && (pIVar2->opcode_ == OpVariable))) {
    varInst = pIVar2;
    bVar3 = CanReplaceVariable(this,pIVar2);
    if (bVar3) {
      std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(&worklist.c,&varInst);
    }
    ppIVar6 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  SVar5 = SuccessWithoutChange;
  do {
    if (worklist.c.
        super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        worklist.c.
        super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0048b7da;
    pIVar2 = *worklist.c.
              super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    pop_front(&worklist.c);
    SVar4 = ReplaceVariable(this,pIVar2,&worklist);
    if (SVar4 == SuccessWithChange) {
      SVar5 = SuccessWithChange;
    }
  } while (SVar4 != Failure);
  SVar5 = Failure;
LAB_0048b7da:
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base((_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&worklist);
  return SVar5;
}

Assistant:

Pass::Status ScalarReplacementPass::ProcessFunction(Function* function) {
  std::queue<Instruction*> worklist;
  BasicBlock& entry = *function->begin();
  for (auto iter = entry.begin(); iter != entry.end(); ++iter) {
    // Function storage class OpVariables must appear as the first instructions
    // of the entry block.
    if (iter->opcode() != spv::Op::OpVariable) break;

    Instruction* varInst = &*iter;
    if (CanReplaceVariable(varInst)) {
      worklist.push(varInst);
    }
  }

  Status status = Status::SuccessWithoutChange;
  while (!worklist.empty()) {
    Instruction* varInst = worklist.front();
    worklist.pop();

    Status var_status = ReplaceVariable(varInst, &worklist);
    if (var_status == Status::Failure)
      return var_status;
    else if (var_status == Status::SuccessWithChange)
      status = var_status;
  }

  return status;
}